

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::iterate
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration> *this)

{
  bool bVar1;
  TestError *this_00;
  string local_40;
  
  (*(this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[5])
            (this,(this->m_results).
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  (this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[this->m_iterationNdx]);
  this->m_iterationNdx = this->m_iterationNdx + 1;
  if (this->m_numUnmapFailures < 4) {
    bVar1 = this->m_iterationNdx <
            (int)((ulong)((long)(this->m_iterationOrder).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->m_iterationOrder).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    if (!bVar1) {
      (*(this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[6])(this,&this->m_results);
    }
    return (uint)bVar1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Got too many unmap errors","");
  tcu::TestError::TestError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

typename RenderCase<SampleType>::IterateResult RenderCase<SampleType>::iterate (void)
{
	const int		unmapFailureThreshold	= 3;
	const int		currentIteration		= m_iterationNdx;
	const int		currentConfigNdx		= m_iterationOrder[currentIteration];
	SampleResult&	currentSample			= m_results[currentConfigNdx];

	try
	{
		runSample(currentSample);
		++m_iterationNdx;
	}
	catch (const UnmapFailureError& ex)
	{
		DE_UNREF(ex);
		++m_numUnmapFailures;
	}

	if (m_numUnmapFailures > unmapFailureThreshold)
		throw tcu::TestError("Got too many unmap errors");

	if (m_iterationNdx < (int)m_iterationOrder.size())
		return CONTINUE;

	logAndSetTestResult(m_results);
	return STOP;
}